

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O0

void g_tree_traverse(GTree *tree,GTraverseFunc traverse_func,GTraverseType traverse_type,
                    gpointer user_data)

{
  gpointer user_data_local;
  GTraverseType traverse_type_local;
  GTraverseFunc traverse_func_local;
  GTree *tree_local;
  
  if (tree->root != (GTreeNode *)0x0) {
    switch(traverse_type) {
    case G_IN_ORDER:
      g_tree_node_in_order(tree->root,traverse_func,user_data);
      break;
    case G_PRE_ORDER:
      g_tree_node_pre_order(tree->root,traverse_func,user_data);
      break;
    case G_POST_ORDER:
      g_tree_node_post_order(tree->root,traverse_func,user_data);
      break;
    case G_LEVEL_ORDER:
    }
  }
  return;
}

Assistant:

void g_tree_traverse (GTree *tree,
        GTraverseFunc  traverse_func,
        GTraverseType  traverse_type,
        gpointer       user_data)
{
    g_return_if_fail (tree != NULL);

    if (!tree->root)
        return;

    switch (traverse_type)
    {
        case G_PRE_ORDER:
            g_tree_node_pre_order (tree->root, traverse_func, user_data);
            break;

        case G_IN_ORDER:
            g_tree_node_in_order (tree->root, traverse_func, user_data);
            break;

        case G_POST_ORDER:
            g_tree_node_post_order (tree->root, traverse_func, user_data);
            break;

        case G_LEVEL_ORDER:
            //g_warning ("g_tree_traverse(): traverse type G_LEVEL_ORDER isn't implemented.");
            break;
    }
}